

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_icu::utf8_converter_impl::convert_abi_cxx11_
          (string *__return_storage_ptr__,utf8_converter_impl *this,conversion_type how,char *begin,
          char *end,int flags)

{
  code *func;
  UnicodeString str;
  icu_std_converter<char,_1> cvt;
  icu_std_converter<char,_1> iStack_b8;
  string local_78;
  undefined1 local_58 [48];
  
  switch(how) {
  case normalization:
    std::__cxx11::string::string((string *)&local_78,"UTF-8",(allocator *)&iStack_b8);
    icu_std_converter<char,_1>::icu_std_converter
              ((icu_std_converter<char,_1> *)local_58,&local_78,cvt_skip);
    std::__cxx11::string::~string((string *)&local_78);
    icu_std_converter<char,_1>::icu(&iStack_b8,local_58,begin);
    anon_unknown_11::normalize_string((UnicodeString *)&iStack_b8,flags);
    icu_std_converter<char,1>::std_abi_cxx11_
              (__return_storage_ptr__,local_58,(UnicodeString *)&iStack_b8);
    icu_70::UnicodeString::~UnicodeString((UnicodeString *)&iStack_b8);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    return __return_storage_ptr__;
  case upper_case:
    func = ucasemap_utf8ToUpper_70;
    break;
  case lower_case:
    func = ucasemap_utf8ToLower_70;
    break;
  case case_folding:
    func = ucasemap_utf8FoldCase_70;
    break;
  case title_case:
    raii_casemap::raii_casemap((raii_casemap *)&iStack_b8,&this->locale_id_);
    raii_casemap::convert<int(*)(UCaseMap*,char*,int,char_const*,int,UErrorCode*)>
              (__return_storage_ptr__,(raii_casemap *)&iStack_b8,ucasemap_utf8ToTitle_70,begin,end);
    raii_casemap::~raii_casemap((raii_casemap *)&iStack_b8);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,begin,end);
    return __return_storage_ptr__;
  }
  raii_casemap::convert<int(*)(UCaseMap_const*,char*,int,char_const*,int,UErrorCode*)>
            (__return_storage_ptr__,&this->map_,func,begin,end);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string convert(converter_base::conversion_type how,char const *begin,char const *end,int flags = 0) const
        {
            
            if(how == converter_base::normalization) {
                icu_std_converter<char> cvt("UTF-8");
                icu::UnicodeString str=cvt.icu(begin,end);
                normalize_string(str,flags);
                return cvt.std(str);
            }
            
            switch(how) 
            {
            case converter_base::upper_case:
                return map_.convert(ucasemap_utf8ToUpper,begin,end);
            case converter_base::lower_case:
                return map_.convert(ucasemap_utf8ToLower,begin,end);
            case converter_base::title_case:
                {
                    // Non-const method, so need to create a separate map
                    raii_casemap map(locale_id_);
                    return map.convert(ucasemap_utf8ToTitle,begin,end);
                }
            case converter_base::case_folding:
                return map_.convert(ucasemap_utf8FoldCase,begin,end);
            default:
                return std::string(begin,end-begin);
            }
        }